

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

char * UnicodeToString(char *cc)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  int size;
  int local_1c;
  
  sVar3 = strlen(cc);
  uVar4 = (int)sVar3 + 1;
  if (out.Count <= uVar4 && uVar4 - out.Count != 0) {
    TArray<char,_char>::Grow(&out,uVar4 - out.Count);
  }
  out.Count = uVar4;
  if (*cc == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar2 = utf8_decode(cc,&local_1c);
      uVar4 = 0x3f;
      if (uVar2 < 0x100) {
        uVar4 = uVar2;
      }
      out.Array[uVar5] = (char)uVar4;
      uVar5 = uVar5 + 1;
      pcVar1 = cc + local_1c;
      cc = cc + local_1c;
    } while (*pcVar1 != '\0');
    uVar5 = uVar5 & 0xffffffff;
  }
  out.Array[uVar5] = '\0';
  return out.Array;
}

Assistant:

static const char *UnicodeToString(const char *cc)
{
	out.Resize((unsigned)strlen(cc) + 1);
	int ndx = 0;
	while (*cc != 0)
	{
		int size;
		int c = utf8_decode(cc, &size);
		if (c < 0 || c > 255) c = '?';
		out[ndx++] = c;
		cc += size;
	}
	out[ndx] = 0;
	return &out[0];
}